

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConditionalStatements.cpp
# Opt level: O2

ER __thiscall
slang::ast::ConditionalStatement::evalImpl(ConditionalStatement *this,EvalContext *context)

{
  ER EVar1;
  Diagnostic *pDVar2;
  char *pcVar3;
  EvalContext *visitor_00;
  bool bVar4;
  string_view arg;
  EvalConditionalVisitor visitor;
  
  visitor.items.super_SmallVectorBase<const_slang::ast::Statement_*>.data_ =
       (pointer)visitor.items.super_SmallVectorBase<const_slang::ast::Statement_*>.firstElement;
  visitor.items.super_SmallVectorBase<const_slang::ast::Statement_*>.len = 0;
  visitor.items.super_SmallVectorBase<const_slang::ast::Statement_*>.cap = 5;
  visitor.bad = false;
  visitor_00 = (EvalContext *)&visitor;
  visitor.context = context;
  Statement::visit<slang::ast::EvalConditionalVisitor&>
            (&this->super_Statement,(EvalConditionalVisitor *)visitor_00);
  EVar1 = Fail;
  if (visitor.bad == false) {
    if (visitor.items.super_SmallVectorBase<const_slang::ast::Statement_*>.len == 0) {
      EVar1 = Success;
      if ((this->check | Unique0) == Priority) {
        pDVar2 = EvalContext::addDiag
                           (context,(DiagCode)0x14000c,
                            ((this->conditions)._M_ptr
                             [(this->conditions)._M_extent._M_extent_value - 1].expr.ptr)->
                            sourceRange);
        bVar4 = this->check == Priority;
        pcVar3 = "unique";
        if (bVar4) {
          pcVar3 = "priority";
        }
        visitor_00 = (EvalContext *)((ulong)bVar4 * 2 + 6);
        arg._M_str = pcVar3;
        arg._M_len = (size_t)visitor_00;
        Diagnostic::operator<<(pDVar2,arg);
      }
    }
    else {
      if (visitor.items.super_SmallVectorBase<const_slang::ast::Statement_*>.len != 1 &&
          this->check - Unique < 2) {
        pDVar2 = EvalContext::addDiag
                           (context,(DiagCode)0x11000c,
                            visitor.items.super_SmallVectorBase<const_slang::ast::Statement_*>.data_
                            [1]->sourceRange);
        Diagnostic::addNote(pDVar2,(DiagCode)0xb0001,
                            (*visitor.items.super_SmallVectorBase<const_slang::ast::Statement_*>.
                              data_)->sourceRange);
      }
      EVar1 = Statement::eval(*visitor.items.super_SmallVectorBase<const_slang::ast::Statement_*>.
                               data_,context);
      visitor_00 = context;
    }
  }
  SmallVectorBase<const_slang::ast::Statement_*>::cleanup
            (&visitor.items.super_SmallVectorBase<const_slang::ast::Statement_*>,
             (EVP_PKEY_CTX *)visitor_00);
  return EVar1;
}

Assistant:

ER ConditionalStatement::evalImpl(EvalContext& context) const {
    EvalConditionalVisitor visitor(context);
    this->visit(visitor);
    if (visitor.bad)
        return ER::Fail;

    if (visitor.items.empty()) {
        if (check == UniquePriorityCheck::Priority || check == UniquePriorityCheck::Unique) {
            auto& diag = context.addDiag(diag::ConstEvalNoIfItemsMatched,
                                         conditions.back().expr->sourceRange);
            diag << (check == UniquePriorityCheck::Priority ? "priority"sv : "unique"sv);
        }
        return ER::Success;
    }

    bool unique = check == UniquePriorityCheck::Unique || check == UniquePriorityCheck::Unique0;
    if (unique && visitor.items.size() > 1) {
        auto& diag = context.addDiag(diag::ConstEvalIfItemsNotUnique,
                                     visitor.items[1]->sourceRange);
        diag.addNote(diag::NotePreviousMatch, visitor.items[0]->sourceRange);
    }

    return visitor.items[0]->eval(context);
}